

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::PlaTask::checkArguments
          (PlaTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Scope *pSVar1;
  Compilation *pCVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  ConstantRange CVar6;
  Type *pTVar7;
  char *func;
  Expression *pEVar8;
  ulong uVar9;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
LAB_0039a44b:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  pCVar2 = pSVar1->compilation;
  bVar3 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,3,3);
  if (bVar3) {
    if (args->size_ != 0) {
      uVar9 = 0;
      do {
        pTVar7 = (args->data_[uVar9]->type).ptr;
        if (pTVar7 == (Type *)0x0) {
          func = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          goto LAB_0039a44b;
        }
        if (uVar9 == 0) {
          bVar3 = Type::isUnpackedArray(pTVar7);
          if (bVar3) {
            pTVar4 = Type::getArrayElementType(pTVar7);
            bVar3 = Type::isSimpleBitVector(pTVar4);
            if (bVar3) {
              pTVar5 = pTVar4->canonical;
              if (pTVar5 == (Type *)0x0) {
                Type::resolveCanonical(pTVar4);
                pTVar5 = pTVar4->canonical;
              }
              if ((pTVar5->super_Symbol).kind != PredefinedIntegerType) {
                bVar3 = Type::hasFixedRange(pTVar4);
                if ((bVar3) && (CVar6 = Type::getFixedRange(pTVar4), CVar6.right < CVar6.left)) {
                  if (args->size_ != 0) {
                    pEVar8 = *args->data_;
                    goto LAB_0039a409;
                  }
                  goto LAB_0039a455;
                }
                goto LAB_0039a360;
              }
            }
          }
          if (args->size_ != 0) {
            pEVar8 = *args->data_;
            goto LAB_0039a3d4;
          }
          goto LAB_0039a455;
        }
        bVar3 = Type::isSimpleBitVector(pTVar7);
        if (!bVar3) {
LAB_0039a3b0:
          if (uVar9 < args->size_) {
            pEVar8 = args->data_[uVar9];
LAB_0039a3d4:
            pTVar7 = SystemSubroutine::badArg((SystemSubroutine *)this,context,pEVar8);
            return pTVar7;
          }
LAB_0039a455:
          std::terminate();
        }
        pTVar4 = pTVar7->canonical;
        if (pTVar4 == (Type *)0x0) {
          Type::resolveCanonical(pTVar7);
          pTVar4 = pTVar7->canonical;
        }
        if ((pTVar4->super_Symbol).kind == PredefinedIntegerType) goto LAB_0039a3b0;
LAB_0039a360:
        bVar3 = Type::hasFixedRange(pTVar7);
        if ((bVar3) && (CVar6 = Type::getFixedRange(pTVar7), CVar6.right < CVar6.left)) {
          if (uVar9 < args->size_) {
            pEVar8 = args->data_[uVar9];
LAB_0039a409:
            pTVar7 = badRange(context,pEVar8);
            return pTVar7;
          }
          goto LAB_0039a455;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < args->size_);
    }
    pTVar7 = pCVar2->voidType;
  }
  else {
    pTVar7 = pCVar2->errorType;
  }
  return pTVar7;
}

Assistant:

SimpleSystemTask(const std::string& name, const Type& returnType, size_t requiredArgs = 0,
                     const std::vector<const Type*>& argTypes = {}) :
        SimpleSystemSubroutine(name, SubroutineKind::Task, requiredArgs, argTypes, returnType,
                               false) {}